

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
testing::internal::
ValueArray<std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>,std::tuple<char_const*,char_const*>>
::
MakeVector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul>
          (void *__return_storage_ptr__,undefined8 *this)

{
  char *pcVar1;
  char *pcVar2;
  initializer_list<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  __l;
  allocator_type local_1a1;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1a0;
  size_t local_180;
  char *local_178;
  size_t local_170;
  char *local_168;
  size_t local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  size_t local_130;
  char *local_128;
  size_t local_120;
  char *local_118;
  size_t local_110;
  char *local_108;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  char *local_d8;
  size_t local_d0;
  char *local_c8;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  char *local_88;
  size_t local_80;
  char *local_78;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  
  pcVar1 = (char *)*this;
  local_1a0.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = strlen(pcVar1);
  pcVar2 = (char *)this[1];
  local_1a0.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
  super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = pcVar1;
  local_1a0.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = strlen(pcVar2);
  pcVar1 = (char *)this[2];
  local_1a0.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = pcVar2;
  local_180 = strlen(pcVar1);
  pcVar2 = (char *)this[3];
  local_178 = pcVar1;
  local_170 = strlen(pcVar2);
  pcVar1 = (char *)this[4];
  local_168 = pcVar2;
  local_160 = strlen(pcVar1);
  pcVar2 = (char *)this[5];
  local_158 = pcVar1;
  local_150 = strlen(pcVar2);
  pcVar1 = (char *)this[6];
  local_148 = pcVar2;
  local_140 = strlen(pcVar1);
  pcVar2 = (char *)this[7];
  local_138 = pcVar1;
  local_130 = strlen(pcVar2);
  pcVar1 = (char *)this[8];
  local_128 = pcVar2;
  local_120 = strlen(pcVar1);
  pcVar2 = (char *)this[9];
  local_118 = pcVar1;
  local_110 = strlen(pcVar2);
  pcVar1 = (char *)this[10];
  local_108 = pcVar2;
  local_100 = strlen(pcVar1);
  pcVar2 = (char *)this[0xb];
  local_f8 = pcVar1;
  local_f0 = strlen(pcVar2);
  pcVar1 = (char *)this[0xc];
  local_e8 = pcVar2;
  local_e0 = strlen(pcVar1);
  pcVar2 = (char *)this[0xd];
  local_d8 = pcVar1;
  local_d0 = strlen(pcVar2);
  pcVar1 = (char *)this[0xe];
  local_c8 = pcVar2;
  local_c0 = strlen(pcVar1);
  pcVar2 = (char *)this[0xf];
  local_b8 = pcVar1;
  local_b0 = strlen(pcVar2);
  pcVar1 = (char *)this[0x10];
  local_a8 = pcVar2;
  local_a0 = strlen(pcVar1);
  pcVar2 = (char *)this[0x11];
  local_98 = pcVar1;
  local_90 = strlen(pcVar2);
  pcVar1 = (char *)this[0x12];
  local_88 = pcVar2;
  local_80 = strlen(pcVar1);
  pcVar2 = (char *)this[0x13];
  local_78 = pcVar1;
  local_70 = strlen(pcVar2);
  pcVar1 = (char *)this[0x14];
  local_68 = pcVar2;
  local_60 = strlen(pcVar1);
  pcVar2 = (char *)this[0x15];
  local_58 = pcVar1;
  local_50 = strlen(pcVar2);
  pcVar1 = (char *)this[0x16];
  local_48 = pcVar2;
  local_40 = strlen(pcVar1);
  pcVar2 = (char *)this[0x17];
  local_38 = pcVar1;
  local_30 = strlen(pcVar2);
  __l._M_len = 0xc;
  __l._M_array = &local_1a0;
  local_28 = pcVar2;
  std::
  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::vector((vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)__return_storage_ptr__,__l,&local_1a1);
  return (vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *)__return_storage_ptr__;
}

Assistant:

std::vector<T> MakeVector(std::index_sequence<I...>) const {
    return std::vector<T>{static_cast<T>(v_.template Get<I>())...};
  }